

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SimplePragmaExpressionSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SimplePragmaExpressionSyntax *pSVar6;
  
  pSVar6 = (SimplePragmaExpressionSyntax *)allocate(this,0x28,8);
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pSVar6->super_PragmaExpressionSyntax).super_SyntaxNode.kind = SimplePragmaExpression;
  (pSVar6->super_PragmaExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar6->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar6->value).kind = TVar2;
  (pSVar6->value).field_0x2 = uVar3;
  (pSVar6->value).numFlags = (NumericTokenFlags)NVar4.raw;
  (pSVar6->value).rawLen = uVar5;
  (pSVar6->value).info = pIVar1;
  return pSVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }